

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

Interface * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::GetBlock(ProgramInterface *this,GLchar *name)

{
  Interface *pIVar1;
  
  pIVar1 = findInterfaceByName(&this->m_blocks,name);
  return pIVar1;
}

Assistant:

Interface* ProgramInterface::GetBlock(const GLchar* name)
{
	return findInterfaceByName(m_blocks, name);
}